

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

FunctionSignature * __thiscall
Jinx::Impl::Library::FindFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,FunctionSignature *signature)

{
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  copy;
  
  std::mutex::lock(&this->m_functionMutex);
  copy = std::
         __find_if<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature_const*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,__gnu_cxx::__ops::_Iter_equals_val<Jinx::Impl::FunctionSignature_const>>
                   ((this->m_functionList).
                    super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->m_functionList).
                    super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish,signature);
  if (copy._M_current ==
      (this->m_functionList).
      super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  else {
    FunctionSignature::FunctionSignature(__return_storage_ptr__,copy._M_current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Library::FindFunctionSignature(const FunctionSignature & signature) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
		if (itr == m_functionList.end())
			return FunctionSignature();
		return *itr;
	}